

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time.cc
# Opt level: O0

ostream * __thiscall
absl::lts_20240722::time_internal::operator<<(time_internal *this,ostream *os,CivilYear y)

{
  ostream *poVar1;
  string local_40;
  time_internal *local_20;
  ostream *os_local;
  CivilYear y_local;
  
  y_local.f_.y = y.f_.y;
  local_20 = this;
  os_local = os;
  FormatCivilTime_abi_cxx11_(&local_40,(lts_20240722 *)os,y);
  poVar1 = std::operator<<((ostream *)this,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, CivilYear y) {
  return os << FormatCivilTime(y);
}